

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

BrotliDecoderErrorCode
duckdb_brotli::ReadHuffmanCode
          (uint64_t alphabet_size_max,uint64_t alphabet_size_limit,HuffmanCode *table,
          uint64_t *opt_table_size,BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  uint16_t *count;
  uint8_t *code_lengths;
  uint16_t *puVar1;
  short *psVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  uint *puVar6;
  bool bVar7;
  BrotliRunningHuffmanState BVar8;
  uint uVar9;
  int iVar10;
  uint32_t uVar11;
  ulong uVar12;
  uint64_t uVar13;
  ulong uVar14;
  sbyte sVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint64_t uVar19;
  uint16_t *puVar20;
  uint *puVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  long lVar24;
  byte *pbVar25;
  long lVar26;
  ulong uVar27;
  uint64_t uVar28;
  ulong local_50;
  
  br = &s->br;
  count = (s->arena).header.code_length_histo;
  code_lengths = (s->arena).header.code_length_code_lengths;
  BVar8 = (s->arena).header.substate_huffman;
  while (BVar8 == BROTLI_STATE_HUFFMAN_NONE) {
    uVar16 = (s->br).bit_pos_;
    if (uVar16 < 2) {
      pbVar25 = (s->br).next_in;
      if (pbVar25 == (s->br).last_in) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar12 = (ulong)*pbVar25 << ((byte)uVar16 & 0x3f) | (s->br).val_;
      uVar16 = uVar16 | 8;
      (s->br).next_in = pbVar25 + 1;
    }
    else {
      uVar12 = br->val_;
    }
    uVar18 = (ulong)((uint)uVar12 & 3);
    (s->arena).header.sub_loop_counter = uVar18;
    uVar16 = uVar16 - 2;
    (s->br).bit_pos_ = uVar16;
    (s->br).val_ = uVar12 >> 2;
    if (uVar18 == 1) goto LAB_01c09c25;
    (s->arena).header.space = 0x20;
    (s->arena).header.repeat = 0;
    *(undefined1 (*) [16])((long)&s->arena + 0x6f6) = (undefined1  [16])0x0;
    code_lengths[0] = '\0';
    code_lengths[1] = '\0';
    code_lengths[2] = '\0';
    code_lengths[3] = '\0';
    code_lengths[4] = '\0';
    code_lengths[5] = '\0';
    code_lengths[6] = '\0';
    code_lengths[7] = '\0';
    code_lengths[8] = '\0';
    code_lengths[9] = '\0';
    code_lengths[10] = '\0';
    code_lengths[0xb] = '\0';
    code_lengths[0xc] = '\0';
    code_lengths[0xd] = '\0';
    code_lengths[0xe] = '\0';
    code_lengths[0xf] = '\0';
    (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
    BVar8 = BROTLI_STATE_HUFFMAN_COMPLEX;
  }
  switch(BVar8) {
  case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
    uVar16 = (s->br).bit_pos_;
LAB_01c09c25:
    if (uVar16 < 2) {
      pbVar25 = (s->br).next_in;
      if (pbVar25 == (s->br).last_in) {
        (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar18 = (ulong)*pbVar25 << ((byte)uVar16 & 0x3f) | (s->br).val_;
      uVar16 = uVar16 | 8;
      (s->br).next_in = pbVar25 + 1;
    }
    else {
      uVar18 = br->val_;
    }
    uVar12 = (ulong)((uint)uVar18 & 3);
    (s->arena).header.symbol = uVar12;
    (s->br).bit_pos_ = uVar16 - 2;
    (s->br).val_ = uVar18 >> 2;
    (s->arena).header.sub_loop_counter = 0;
    uVar19 = 0;
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_READ:
    uVar19 = (s->arena).header.sub_loop_counter;
    uVar12 = (s->arena).header.symbol;
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD:
    uVar12 = (s->arena).header.symbol;
    goto LAB_01c09ca6;
  case BROTLI_STATE_HUFFMAN_COMPLEX:
    uVar16 = (s->arena).header.sub_loop_counter;
    uVar19 = (s->arena).header.repeat;
    uVar23 = (s->arena).header.space;
    if (uVar16 < 0x12) {
      uVar12 = (s->br).bit_pos_;
      do {
        bVar3 = kCodeLengthCodeOrder[uVar16];
        if (uVar12 < 4) {
          pbVar25 = (s->br).next_in;
          if (pbVar25 != (s->br).last_in) {
            uVar28 = (ulong)*pbVar25 << ((byte)uVar12 & 0x3f) | (s->br).val_;
            uVar12 = uVar12 | 8;
            (s->br).next_in = pbVar25 + 1;
            goto LAB_01c09d55;
          }
          if (uVar12 == 0) {
            uVar14 = 0;
          }
          else {
            uVar14 = (ulong)((uint)br->val_ & 0xf);
          }
          uVar18 = (ulong)(byte)(&kCodeLengthPrefixLength)[uVar14];
          if (uVar12 < uVar18) {
            (s->arena).header.sub_loop_counter = uVar16;
            (s->arena).header.repeat = uVar19;
            (s->arena).header.space = uVar23;
            (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          uVar28 = br->val_;
        }
        else {
          uVar28 = br->val_;
LAB_01c09d55:
          uVar14 = (ulong)((uint)uVar28 & 0xf);
          uVar18 = (ulong)(byte)(&kCodeLengthPrefixLength)[uVar14];
        }
        bVar4 = kCodeLengthPrefixValue[uVar14];
        uVar12 = uVar12 - uVar18;
        (s->br).bit_pos_ = uVar12;
        (s->br).val_ = uVar28 >> ((byte)uVar18 & 0x3f);
        *(byte *)((long)&s->arena + (ulong)bVar3 + 0x6e8) = bVar4;
        if ((0x1111U >> (int)uVar14 & 1) == 0) {
          count[bVar4] = count[bVar4] + 1;
          uVar23 = uVar23 - (0x20 >> (bVar4 & 0x1f));
          uVar19 = uVar19 + 1;
          if (uVar23 - 0x21 < 0xffffffffffffffe0) break;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x12);
    }
    if ((uVar19 != 1) && (uVar23 != 0)) {
      return BROTLI_DECODER_ERROR_FORMAT_CL_SPACE;
    }
    BrotliBuildCodeLengthsHuffmanTable((s->arena).header.table,code_lengths,count);
    *(undefined1 (*) [16])((long)&s->arena + 0x70a) = (undefined1  [16])0x0;
    count[0] = 0;
    count[1] = 0;
    count[2] = 0;
    count[3] = 0;
    count[4] = 0;
    count[5] = 0;
    count[6] = 0;
    count[7] = 0;
    puVar20 = (s->arena).header.symbol_lists;
    lVar17 = 0;
    do {
      uVar9 = (uint)lVar17;
      puVar21 = (uint *)((long)&s->arena + lVar17 * 4 + 0x668);
      *puVar21 = uVar9 | 0xfffffff0;
      puVar21[1] = uVar9 | 0xfffffff1;
      puVar21[2] = uVar9 | 0xfffffff2;
      puVar21[3] = uVar9 | 0xfffffff3;
      puVar1 = puVar20 + (int)(uVar9 | 0xfffffff0);
      puVar1[0] = 0xffff;
      puVar1[1] = 0xffff;
      puVar1[2] = 0xffff;
      puVar1[3] = 0xffff;
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0x10);
    *(undefined1 (*) [16])((long)&s->arena + 0x28) = (undefined1  [16])0x0;
    (s->arena).header.prev_code_len = 8;
    (s->arena).header.repeat_code_len = 0;
    (s->arena).header.space = 0x8000;
    (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
    uVar23 = 0x8000;
    local_50 = 8;
    uVar16 = 0;
    uVar19 = 0;
    uVar28 = 0;
    goto LAB_01c09ff7;
  case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS:
    uVar28 = (s->arena).header.symbol;
    uVar19 = (s->arena).header.repeat;
    uVar23 = (s->arena).header.space;
    uVar16 = (s->arena).header.repeat_code_len;
    local_50 = (s->arena).header.prev_code_len;
    puVar20 = (s->arena).header.symbol_lists;
LAB_01c09ff7:
    iVar10 = BrotliWarmupBitReader(br);
    if (iVar10 == 0) {
      uVar28 = (s->arena).header.symbol;
      uVar23 = (s->arena).header.space;
LAB_01c0a282:
      if (uVar28 < alphabet_size_limit) {
        bVar7 = false;
        do {
          if (uVar23 == 0) goto LAB_01c0a4b5;
          if (bVar7) {
            pbVar25 = (s->br).next_in;
            if (pbVar25 == (s->br).last_in) {
              return BROTLI_DECODER_NEEDS_MORE_INPUT;
            }
            uVar19 = (s->br).bit_pos_;
            (s->br).val_ = (s->br).val_ | (ulong)*pbVar25 << ((byte)uVar19 & 0x3f);
            uVar16 = uVar19 + 8;
            (s->br).bit_pos_ = uVar16;
            (s->br).next_in = pbVar25 + 1;
          }
          else {
            uVar16 = (s->br).bit_pos_;
          }
          if (uVar16 == 0) {
            uVar12 = 0;
          }
          else {
            uVar12 = (ulong)(uint)br->val_;
          }
          uVar14 = (ulong)((uint)uVar12 & 0x1f);
          bVar3 = (byte)s->trivial_literal_contexts[uVar14 + 0x18];
          uVar18 = (ulong)bVar3;
          bVar7 = true;
          if (uVar18 <= uVar16) {
            uVar5 = *(ushort *)((long)s->trivial_literal_contexts + uVar14 * 4 + 0x62);
            uVar14 = (ulong)uVar5;
            if (uVar14 < 0x10) {
              (s->br).bit_pos_ = uVar16 - uVar18;
              (s->br).val_ = (s->br).val_ >> (bVar3 & 0x3f);
              (s->arena).header.repeat = 0;
              if (uVar14 != 0) {
                (s->arena).header.symbol_lists[*(int *)((long)&s->arena + uVar14 * 4 + 0x668)] =
                     (uint16_t)uVar28;
                *(int *)((long)&s->arena + uVar14 * 4 + 0x668) = (int)uVar28;
                (s->arena).header.prev_code_len = uVar14;
                uVar23 = uVar23 - (0x8000 >> ((byte)uVar5 & 0x1f));
                (s->arena).header.space = uVar23;
                psVar2 = (short *)((long)&s->arena + uVar14 * 2 + 0x6fa);
                *psVar2 = *psVar2 + 1;
              }
              uVar28 = uVar28 + 1;
              (s->arena).header.symbol = uVar28;
              bVar7 = false;
            }
            else {
              uVar18 = (uVar14 + uVar18) - 0xe;
              if (uVar18 <= uVar16) {
                uVar12 = (ulong)((uint)(uVar12 >> (bVar3 & 0x3f)) &
                                *(uint *)("" + uVar14 * 8 + 0x90));
                (s->br).bit_pos_ = uVar16 - uVar18;
                (s->br).val_ = (s->br).val_ >> ((byte)uVar18 & 0x3f);
                if (uVar14 == 0x10) {
                  uVar19 = (s->arena).header.prev_code_len;
                  sVar15 = 2;
                }
                else {
                  sVar15 = 3;
                  uVar19 = 0;
                }
                if ((s->arena).header.repeat_code_len == uVar19) {
                  uVar13 = (s->arena).header.repeat;
                  if (uVar13 == 0) goto LAB_01c0a3f6;
                  lVar17 = uVar13 - 2 << sVar15;
                }
                else {
                  (s->arena).header.repeat_code_len = uVar19;
LAB_01c0a3f6:
                  lVar17 = 0;
                  uVar13 = 0;
                }
                puVar20 = (s->arena).header.symbol_lists;
                uVar22 = uVar12 + lVar17 + 3;
                (s->arena).header.repeat = uVar22;
                lVar24 = uVar22 - uVar13;
                uVar16 = lVar24 + uVar28;
                if (alphabet_size_limit < uVar16) {
                  (s->arena).header.symbol = alphabet_size_limit;
                  (s->arena).header.space = 0xfffff;
                  return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
                }
                if (uVar19 == 0) {
                  (s->arena).header.symbol = uVar16;
                }
                else {
                  iVar10 = *(int *)((long)&s->arena + uVar19 * 4 + 0x668);
                  uVar18 = uVar28 & 0xffffffff;
                  lVar26 = 0;
                  do {
                    puVar20[iVar10] = (uint16_t)uVar18;
                    lVar26 = lVar26 + -1;
                    iVar10 = (int)uVar18;
                    uVar18 = (ulong)(iVar10 + 1);
                  } while (((uVar13 - lVar17) - uVar12) + -3 != lVar26);
                  (s->arena).header.symbol = uVar16;
                  *(uint *)((long)&s->arena + uVar19 * 4 + 0x668) = ~(uint)lVar26 + (int)uVar28;
                  uVar23 = uVar23 - (lVar24 << (0xfU - (char)uVar19 & 0x3f));
                  (s->arena).header.space = uVar23;
                  psVar2 = (short *)((long)&s->arena + uVar19 * 2 + 0x6fa);
                  *psVar2 = *psVar2 + (short)lVar24;
                }
                bVar7 = false;
                uVar28 = uVar16;
              }
            }
          }
        } while (uVar28 < alphabet_size_limit);
      }
    }
    else {
      if (uVar23 != 0 && uVar28 < alphabet_size_limit) {
        puVar21 = (uint *)(s->br).next_in;
        puVar6 = (uint *)(s->br).guard_in;
        do {
          if (puVar6 <= puVar21) {
            (s->arena).header.symbol = uVar28;
            (s->arena).header.repeat = uVar19;
            (s->arena).header.prev_code_len = local_50;
            (s->arena).header.repeat_code_len = uVar16;
            (s->arena).header.space = uVar23;
            goto LAB_01c0a282;
          }
          uVar12 = (s->br).val_;
          uVar18 = (s->br).bit_pos_;
          if (uVar18 < 0x21) {
            uVar12 = uVar12 | (ulong)*puVar21 << ((byte)uVar18 & 0x3f);
            uVar18 = uVar18 + 0x20;
            puVar21 = puVar21 + 1;
            (s->br).next_in = (uint8_t *)puVar21;
          }
          uVar14 = (ulong)((uint)uVar12 & 0x1f);
          bVar3 = (byte)s->trivial_literal_contexts[uVar14 + 0x18];
          uVar13 = uVar18 - bVar3;
          uVar12 = uVar12 >> (bVar3 & 0x3f);
          (s->br).bit_pos_ = uVar13;
          (s->br).val_ = uVar12;
          uVar5 = *(ushort *)((long)s->trivial_literal_contexts + uVar14 * 4 + 0x62);
          uVar18 = (ulong)uVar5;
          if (uVar18 < 0x10) {
            if (uVar18 != 0) {
              puVar20[*(int *)((long)&s->arena + uVar18 * 4 + 0x668)] = (uint16_t)uVar28;
              *(int *)((long)&s->arena + uVar18 * 4 + 0x668) = (int)uVar28;
              uVar23 = uVar23 - (0x8000 >> ((byte)uVar5 & 0x1f));
              psVar2 = (short *)((long)&s->arena + uVar18 * 2 + 0x6fa);
              *psVar2 = *psVar2 + 1;
              local_50 = uVar18;
            }
            uVar27 = uVar28 + 1;
            uVar19 = 0;
            uVar14 = uVar16;
          }
          else {
            uVar27 = (ulong)(uVar18 == 0x10) ^ 3;
            uVar18 = *(ulong *)(kBrotliBitMask + uVar27 * 8);
            (s->br).bit_pos_ = uVar13 - uVar27;
            uVar14 = 0;
            if (uVar5 == 0x10) {
              uVar14 = local_50;
            }
            (s->br).val_ = uVar12 >> (sbyte)uVar27;
            lVar17 = 0;
            uVar13 = 0;
            if (uVar16 == uVar14) {
              if (uVar19 == 0) {
                uVar13 = 0;
                lVar17 = 0;
                uVar14 = uVar16;
              }
              else {
                lVar17 = uVar19 - 2 << (sbyte)uVar27;
                uVar14 = uVar16;
                uVar13 = uVar19;
              }
            }
            uVar19 = (uVar18 & uVar12) + lVar17 + 3;
            lVar24 = uVar19 - uVar13;
            uVar27 = lVar24 + uVar28;
            if (alphabet_size_limit < uVar27) {
              uVar23 = 0xfffff;
              break;
            }
            if (uVar14 == 0) {
              uVar14 = 0;
            }
            else {
              iVar10 = *(int *)((long)&s->arena + uVar14 * 4 + 0x668);
              uVar16 = uVar28 & 0xffffffff;
              lVar26 = 0;
              do {
                puVar20[iVar10] = (uint16_t)uVar16;
                lVar26 = lVar26 + -1;
                iVar10 = (int)uVar16;
                uVar16 = (ulong)(iVar10 + 1);
              } while (((uVar13 - lVar17) - (uVar18 & uVar12)) + -3 != lVar26);
              *(uint *)((long)&s->arena + uVar14 * 4 + 0x668) = ~(uint)lVar26 + (int)uVar28;
              psVar2 = (short *)((long)&s->arena + uVar14 * 2 + 0x6fa);
              *psVar2 = *psVar2 + (short)lVar24;
              uVar23 = uVar23 - (lVar24 << (0xfU - (char)uVar14 & 0x3f));
            }
          }
          if ((alphabet_size_limit <= uVar27) || (uVar16 = uVar14, uVar28 = uVar27, uVar23 == 0))
          break;
        } while( true );
      }
      (s->arena).header.space = uVar23;
    }
    if (uVar23 != 0) {
      return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
    }
LAB_01c0a4b5:
    uVar11 = BrotliBuildHuffmanTable(table,8,(s->arena).header.symbol_lists,count);
    if (opt_table_size != (uint64_t *)0x0) {
      *opt_table_size = (ulong)uVar11;
    }
    goto LAB_01c0a4df;
  default:
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  uVar18 = alphabet_size_max - 1;
  uVar16 = 0x3f;
  if (uVar18 != 0) {
    for (; uVar18 >> uVar16 == 0; uVar16 = uVar16 - 1) {
    }
  }
  uVar16 = (uVar16 ^ 0xffffffffffffffc0) + 0x41;
  if (uVar18 == 0) {
    uVar16 = 0;
  }
  if (uVar19 <= uVar12) {
    uVar18 = (s->br).bit_pos_;
    do {
      if (uVar18 < uVar16) {
        pbVar25 = (s->br).next_in;
        do {
          if (pbVar25 == (s->br).last_in) {
            (s->arena).header.sub_loop_counter = uVar19;
            (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          uVar23 = (ulong)*pbVar25 << ((byte)uVar18 & 0x3f) | (s->br).val_;
          (s->br).val_ = uVar23;
          uVar18 = uVar18 + 8;
          (s->br).bit_pos_ = uVar18;
          pbVar25 = pbVar25 + 1;
          (s->br).next_in = pbVar25;
        } while (uVar18 < uVar16);
      }
      else {
        uVar23 = br->val_;
      }
      uVar14 = *(ulong *)(kBrotliBitMask + uVar16 * 8);
      uVar18 = uVar18 - uVar16;
      (s->br).bit_pos_ = uVar18;
      (s->br).val_ = uVar23 >> ((byte)uVar16 & 0x3f);
      if (alphabet_size_limit <= (uVar14 & uVar23)) {
        return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET;
      }
      *(short *)((long)&s->arena + uVar19 * 2 + 200) = (short)(uVar14 & uVar23);
      uVar19 = uVar19 + 1;
    } while (uVar19 <= uVar12);
  }
  if (uVar12 == 0) {
    uVar12 = 0;
  }
  else {
    lVar17 = 0x20d;
    uVar16 = 0;
    do {
      lVar24 = uVar16 * 2;
      uVar16 = uVar16 + 1;
      lVar26 = lVar17;
      do {
        if (*(short *)((long)&s->arena + lVar24 + 200) ==
            *(short *)((long)s->dist_rb + lVar26 * 2 + -0x70)) {
          return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
        }
        uVar18 = lVar26 - 0x20b;
        lVar26 = lVar26 + 1;
      } while (uVar18 <= uVar12);
      lVar17 = lVar17 + 1;
    } while (uVar16 != uVar12);
LAB_01c09ca6:
    if (uVar12 == 3) {
      uVar19 = (s->br).bit_pos_;
      if (uVar19 == 0) {
        pbVar25 = (s->br).next_in;
        if (pbVar25 == (s->br).last_in) {
          (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        uVar16 = (ulong)*pbVar25 | (s->br).val_;
        (s->br).next_in = pbVar25 + 1;
        uVar19 = 7;
      }
      else {
        uVar16 = br->val_;
        uVar19 = uVar19 - 1;
      }
      (s->br).bit_pos_ = uVar19;
      (s->br).val_ = uVar16 >> 1;
      uVar12 = (ulong)((uint)uVar16 & 1) + 3;
      (s->arena).header.symbol = uVar12;
    }
  }
  uVar11 = BrotliBuildSimpleHuffmanTable
                     (table,8,(s->arena).header.symbols_lists_array,(uint32_t)uVar12);
  if (opt_table_size != (uint64_t *)0x0) {
    *opt_table_size = (ulong)uVar11;
  }
LAB_01c0a4df:
  (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(brotli_reg_t alphabet_size_max, brotli_reg_t alphabet_size_limit,
                                              HuffmanCode *table, brotli_reg_t *opt_table_size, BrotliDecoderState *s) {
	BrotliBitReader *br = &s->br;
	BrotliMetablockHeaderArena *h = &s->arena.header;
	/* State machine. */
	for (;;) {
		switch (h->substate_huffman) {
		case BROTLI_STATE_HUFFMAN_NONE:
			if (!BrotliSafeReadBits(br, 2, &h->sub_loop_counter)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			BROTLI_LOG_UINT(h->sub_loop_counter);
			/* The value is used as follows:
			   1 for simple code;
			   0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
			if (h->sub_loop_counter != 1) {
				h->space = 32;
				h->repeat = 0; /* num_codes */
				memset(&h->code_length_histo[0], 0,
				       sizeof(h->code_length_histo[0]) * (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
				memset(&h->code_length_code_lengths[0], 0, sizeof(h->code_length_code_lengths));
				h->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
				continue;
			}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
			/* Read symbols, codes & code lengths directly. */
			if (!BrotliSafeReadBits(br, 2, &h->symbol)) { /* num_symbols */
				h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			h->sub_loop_counter = 0;
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
			BrotliDecoderErrorCode result = ReadSimpleHuffmanSymbols(alphabet_size_max, alphabet_size_limit, s);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
		}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
			brotli_reg_t table_size;
			if (h->symbol == 3) {
				brotli_reg_t bits;
				if (!BrotliSafeReadBits(br, 1, &bits)) {
					h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				h->symbol += bits;
			}
			BROTLI_LOG_UINT(h->symbol);
			table_size =
			    BrotliBuildSimpleHuffmanTable(table, HUFFMAN_TABLE_BITS, h->symbols_lists_array, (uint32_t)h->symbol);
			if (opt_table_size) {
				*opt_table_size = table_size;
			}
			h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
			return BROTLI_DECODER_SUCCESS;
		}

		/* Decode Huffman-coded code lengths. */
		case BROTLI_STATE_HUFFMAN_COMPLEX: {
			brotli_reg_t i;
			BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
			BrotliBuildCodeLengthsHuffmanTable(h->table, h->code_length_code_lengths, h->code_length_histo);
			memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo));
			for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
				h->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
				h->symbol_lists[h->next_symbol[i]] = 0xFFFF;
			}

			h->symbol = 0;
			h->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
			h->repeat = 0;
			h->repeat_code_len = 0;
			h->space = 32768;
			h->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
		}
			/* Fall through. */

		case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
			brotli_reg_t table_size;
			BrotliDecoderErrorCode result = ReadSymbolCodeLengths(alphabet_size_limit, s);
			if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
				result = SafeReadSymbolCodeLengths(alphabet_size_limit, s);
			}
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}

			if (h->space != 0) {
				BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", (int)h->space));
				return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
			}
			table_size = BrotliBuildHuffmanTable(table, HUFFMAN_TABLE_BITS, h->symbol_lists, h->code_length_histo);
			if (opt_table_size) {
				*opt_table_size = table_size;
			}
			h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
			return BROTLI_DECODER_SUCCESS;
		}

		default:
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
		}
	}
}